

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  BBoxRect *pBVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  size_t __size;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  pointer pMVar7;
  void *pvVar8;
  void *pvVar9;
  unsigned_long uVar10;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  size_t sVar11;
  bool bVar12;
  pointer pfVar13;
  pointer pfVar14;
  pointer pvVar15;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  float *pfVar20;
  float *pfVar21;
  BBoxRect *pBVar22;
  size_type sVar23;
  void *pvVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  size_type __new_size;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  Mat bboxes;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  vector<float,_std::allocator<float>_> local_1c8;
  vector<float,_std::allocator<float>_> local_1a8;
  DetectionOutput *local_190;
  unsigned_long *local_188;
  iterator iStack_180;
  unsigned_long *local_178;
  ulong local_168;
  unsigned_long local_160;
  int local_154;
  ulong local_150;
  float *local_148;
  undefined8 uStack_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  Allocator *local_128;
  undefined8 uStack_120;
  int local_118;
  int iStack_114;
  long lStack_110;
  vector<float,_std::allocator<float>_> local_108;
  undefined8 local_e8;
  size_type local_d0;
  ulong local_c8;
  pointer local_c0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  Option *local_88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_80;
  long local_78;
  float *local_70;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_154 = this->num_class;
  if (local_154 == -0xe9) {
    local_168 = (ulong)(uint)pMVar7[2].h;
    local_150 = local_168;
  }
  else {
    iVar17 = pMVar7[2].w;
    iVar18 = iVar17 + 3;
    if (-1 < iVar17) {
      iVar18 = iVar17;
    }
    local_168 = (ulong)(uint)(iVar18 >> 2);
    local_150 = 1;
  }
  piVar19 = &this->num_class;
  if (local_154 == -0xe9) {
    piVar19 = &pMVar7[1].h;
  }
  local_d0 = (size_type)*piVar19;
  local_128 = opt->workspace_allocator;
  local_148 = (float *)0x0;
  uStack_140._0_4_ = 0;
  uStack_140._4_4_ = 0;
  uStack_140 = (float *)0x0;
  uStack_138 = 4;
  uStack_134 = 0;
  uStack_130 = 1;
  uStack_120 = 0x400000002;
  local_118 = (int)local_168;
  iStack_114 = 1;
  lVar28 = (long)(local_118 * 4);
  local_190 = this;
  lStack_110 = lVar28;
  if (local_118 != 0) {
    __size = lVar28 * 4 + 4;
    if (local_128 == (Allocator *)0x0) {
      local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (float *)0x0;
      iVar17 = posix_memalign((void **)&local_1c8,0x10,__size);
      local_148 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (iVar17 != 0) {
        local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (float *)0x0;
        local_148 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    else {
      local_148 = (float *)(**(code **)(*(long *)local_128 + 0x10))(local_128,__size);
    }
    uStack_140 = local_148 + lVar28;
    local_148[lVar28] = 1.4013e-45;
  }
  iVar17 = -100;
  if ((local_148 != (float *)0x0) && (iStack_114 * lStack_110 != 0)) {
    pvVar8 = pMVar7[2].data;
    if (local_154 == -0xe9) {
      pvVar24 = (void *)0x0;
    }
    else {
      pvVar24 = (void *)((long)pMVar7[2].w * pMVar7[2].elemsize + (long)pvVar8);
    }
    local_c8 = local_168 & 0xffffffff;
    local_c0 = pMVar7;
    local_88 = opt;
    local_80 = top_blobs;
    if (0 < (int)local_168) {
      pvVar9 = pMVar7->data;
      local_70 = local_190->variances;
      local_78 = (long)uStack_120._4_4_ * CONCAT44(uStack_134,uStack_138);
      lVar26 = local_c8 << 4;
      lVar28 = 0;
      pfVar21 = local_148;
      do {
        pfVar20 = (float *)((long)pvVar24 + lVar28);
        if (pvVar24 == (void *)0x0) {
          pfVar20 = local_70;
        }
        uVar5 = *(undefined8 *)((long)pvVar9 + lVar28);
        local_98 = CONCAT44((float)((ulong)uVar5 >> 0x20) *
                            (float)((ulong)*(undefined8 *)pfVar20 >> 0x20),
                            (float)uVar5 * (float)*(undefined8 *)pfVar20);
        uStack_90 = 0;
        uVar5 = *(undefined8 *)((long)pvVar9 + lVar28 + 8);
        fVar32 = (float)((ulong)uVar5 >> 0x20) *
                 (float)((ulong)*(undefined8 *)(pfVar20 + 2) >> 0x20);
        local_48 = CONCAT44(fVar32,(float)uVar5 * (float)*(undefined8 *)(pfVar20 + 2));
        uStack_40 = 0;
        fVar32 = expf(fVar32);
        local_e8 = CONCAT44(extraout_XMM0_Db,fVar32);
        fVar32 = expf((float)local_48);
        pfVar20 = (float *)((long)pvVar8 + lVar28);
        fVar34 = pfVar20[2] - *pfVar20;
        fVar35 = pfVar20[3] - pfVar20[1];
        fVar31 = (*pfVar20 + pfVar20[2]) * 0.5 + fVar34 * (float)local_98;
        fVar33 = (pfVar20[1] + pfVar20[3]) * 0.5 + fVar35 * local_98._4_4_;
        fVar32 = fVar32 * fVar34 * 0.5;
        fVar34 = (float)local_e8 * fVar35 * 0.5;
        *pfVar21 = fVar31 - fVar32;
        pfVar21[1] = fVar33 - fVar34;
        pfVar21[2] = fVar31 + fVar32;
        pfVar21[3] = fVar33 + fVar34;
        pfVar21 = (float *)((long)pfVar21 + local_78);
        lVar28 = lVar28 + 0x10;
      } while (lVar26 != lVar28);
    }
    __new_size = local_d0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_68,local_d0);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_b8,__new_size);
    if (1 < (int)__new_size) {
      uVar29 = 1;
      if (local_154 != -0xe9) {
        uVar29 = __new_size & 0xffffffff;
      }
      local_150 = local_150 << 2;
      sVar23 = 1;
      local_e8 = local_150;
      do {
        local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (0 < (int)local_168) {
          uVar30 = 0;
          uVar25 = local_e8;
          do {
            fVar32 = *(float *)((long)local_c0[1].data + uVar25);
            local_188 = (unsigned_long *)CONCAT44(local_188._4_4_,fVar32);
            if (local_190->confidence_threshold <= fVar32 &&
                fVar32 != local_190->confidence_threshold) {
              lVar28 = (long)(int)uVar30 * (long)uStack_120._4_4_ * CONCAT44(uStack_134,uStack_138);
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_148 + lVar28 + 4),
                                     *(float *)((long)local_148 + lVar28));
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_148 + lVar28 + 0xc),
                                     *(undefined4 *)((long)local_148 + lVar28 + 8));
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(local_1c8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     (int)sVar23);
              if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1a8,
                           (iterator)
                           local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)&local_1c8);
              }
              else {
                *(int *)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = (int)sVar23;
                *(pointer *)
                 local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(pointer *)
                 ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) =
                     local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_108,
                           (iterator)
                           local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_188);
              }
              else {
                *local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_188._0_4_;
                local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar30 = uVar30 + 1;
            uVar25 = uVar25 + uVar29 * 4;
          } while (local_c8 != uVar30);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1a8,&local_108)
        ;
        iVar17 = local_190->nms_top_k;
        iVar18 = (int)((ulong)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar17,iVar18 * -0x33333333) != iVar17 + iVar18 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1a8,
                     (long)iVar17);
          std::vector<float,_std::allocator<float>_>::resize(&local_108,(long)local_190->nms_top_k);
        }
        pfVar14 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar13 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_188 = (unsigned_long *)0x0;
        local_178 = (unsigned_long *)0x0;
        iStack_180._M_current = (unsigned_long *)0x0;
        local_98 = CONCAT44(local_98._4_4_,local_190->nms_threshold);
        uVar25 = ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1c8,uVar25,(allocator_type *)&local_160);
        if (pfVar14 == pfVar13) {
          local_160 = 0;
        }
        else {
          pfVar21 = (float *)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8);
          lVar28 = 0;
          do {
            uVar4 = ((BBoxRect *)(pfVar21 + -2))->xmin;
            uVar6 = ((BBoxRect *)(pfVar21 + -2))->ymin;
            local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar28] =
                 ((float)((ulong)*(undefined8 *)pfVar21 >> 0x20) - (float)uVar6) *
                 ((float)*(undefined8 *)pfVar21 - (float)uVar4);
            lVar28 = lVar28 + 1;
            pfVar21 = pfVar21 + 5;
          } while (uVar25 + (uVar25 == 0) != lVar28);
          local_160 = 0;
          if (pfVar14 != pfVar13) {
            do {
              uVar27 = (uint)((ulong)((long)iStack_180._M_current - (long)local_188) >> 3);
              if ((int)uVar27 < 1) {
LAB_001640c4:
                if (iStack_180._M_current == local_178) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_188,
                             iStack_180,&local_160);
                }
                else {
                  *iStack_180._M_current = local_160;
                  iStack_180._M_current = iStack_180._M_current + 1;
                }
              }
              else {
                pBVar22 = (BBoxRect *)
                          ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + local_160 * 0x14);
                fVar32 = pBVar22->xmin;
                bVar12 = true;
                uVar30 = 0;
                do {
                  uVar10 = local_188[uVar30];
                  fVar31 = ((BBoxRect *)
                           ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar10 * 0x14))->xmax;
                  fVar33 = 0.0;
                  if (fVar32 <= fVar31) {
                    pBVar1 = (BBoxRect *)
                             ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar10 * 0x14);
                    fVar34 = pBVar22->xmax;
                    fVar35 = pBVar1->xmin;
                    if (fVar35 <= fVar34) {
                      fVar2 = pBVar22->ymin;
                      fVar36 = pBVar1->ymax;
                      if (fVar2 <= fVar36) {
                        fVar3 = pBVar22->ymax;
                        fVar37 = pBVar1->ymin;
                        if (fVar37 <= fVar3) {
                          if (fVar34 <= fVar31) {
                            fVar31 = fVar34;
                          }
                          if (fVar35 <= fVar32) {
                            fVar35 = fVar32;
                          }
                          if (fVar3 <= fVar36) {
                            fVar36 = fVar3;
                          }
                          if (fVar37 <= fVar2) {
                            fVar37 = fVar2;
                          }
                          fVar33 = (fVar36 - fVar37) * (fVar31 - fVar35);
                        }
                      }
                    }
                  }
                  if ((float)local_98 <
                      fVar33 / ((local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[local_160] - fVar33) +
                               local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10])) {
                    bVar12 = false;
                  }
                  uVar30 = uVar30 + 1;
                } while ((uVar27 & 0x7fffffff) != uVar30);
                if (bVar12) goto LAB_001640c4;
              }
              local_160 = local_160 + 1;
            } while (local_160 < uVar25);
          }
        }
        if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (iStack_180._M_current != local_188) {
          uVar25 = 0;
          do {
            uVar10 = local_188[uVar25];
            pBVar22 = (BBoxRect *)
                      ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar10 * 0x14);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_68.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar23);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,pBVar22);
            }
            else {
              (__position._M_current)->label = pBVar22->label;
              fVar32 = pBVar22->ymin;
              fVar31 = pBVar22->xmax;
              fVar33 = pBVar22->ymax;
              (__position._M_current)->xmin = pBVar22->xmin;
              (__position._M_current)->ymin = fVar32;
              (__position._M_current)->xmax = fVar31;
              (__position._M_current)->ymax = fVar33;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_b8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar23);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar10);
            }
            else {
              *__position_00._M_current =
                   local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 < (ulong)((long)iStack_180._M_current - (long)local_188 >> 3));
        }
        if (local_188 != (unsigned_long *)0x0) {
          operator_delete(local_188,(long)local_178 - (long)local_188);
        }
        __new_size = local_d0;
        if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((BBoxRect *)
            local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (BBoxRect *)0x0) {
          operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        sVar23 = sVar23 + 1;
        local_e8 = local_e8 + local_150;
      } while (sVar23 != __new_size);
    }
    pvVar16 = local_80;
    local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (float *)0x0;
    local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (1 < (int)__new_size) {
      lVar28 = 0;
      do {
        pvVar15 = local_b8.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1c8,
                   local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)&local_68.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar28),
                   *(undefined8 *)
                    ((long)&local_68.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_finish + lVar28));
        std::vector<float,std::allocator<float>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  ((vector<float,std::allocator<float>> *)&local_1a8,
                   local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)&pvVar15[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar28),
                   *(undefined8 *)
                    ((long)&pvVar15[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish + lVar28));
        lVar28 = lVar28 + 0x18;
      } while (__new_size * 0x18 + -0x18 != lVar28);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1c8,&local_1a8);
    iVar17 = local_190->keep_top_k;
    iVar18 = (int)((ulong)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    if (SBORROW4(iVar17,iVar18 * -0x33333333) != iVar17 + iVar18 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1c8,(long)iVar17)
      ;
      std::vector<float,_std::allocator<float>_>::resize(&local_1a8,(long)local_190->keep_top_k);
    }
    uVar27 = (int)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar17 = 0;
    if (uVar27 != 0) {
      this_02 = (pvVar16->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar27,4,local_88->blob_allocator);
      iVar17 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar17 = 0, 0 < (int)uVar27)) {
        iVar18 = this_02->w;
        sVar11 = this_02->elemsize;
        pfVar21 = (float *)((long)this_02->data + 0x14);
        pfVar20 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        iVar17 = 0;
        uVar29 = 0;
        do {
          fVar32 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar29];
          pfVar21[-5] = (float)(int)*pfVar20;
          pfVar21[-4] = fVar32;
          pfVar21[-3] = pfVar20[-4];
          pfVar21[-2] = pfVar20[-3];
          pfVar21[-1] = pfVar20[-2];
          *pfVar21 = pfVar20[-1];
          uVar29 = uVar29 + 1;
          pfVar21 = (float *)((long)pfVar21 + (long)iVar18 * sVar11);
          pfVar20 = pfVar20 + 5;
        } while ((uVar27 & 0x7fffffff) != uVar29);
      }
    }
    if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_68);
  }
  if (uStack_140 != (float *)0x0) {
    LOCK();
    *uStack_140 = (float)((int)*uStack_140 + -1);
    UNLOCK();
    if (*uStack_140 == 0.0) {
      if (local_128 == (Allocator *)0x0) {
        if (local_148 != (float *)0x0) {
          free(local_148);
        }
      }
      else {
        (**(code **)(*(long *)local_128 + 0x18))();
      }
    }
  }
  return iVar17;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = static_cast<float>(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = static_cast<float>(exp(var[3] * loc[3]) * pb_h);

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}